

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadManager.hpp
# Opt level: O1

HANDLE __thiscall
Husky::ThreadManager::CreateThread(ThreadManager *this,PThreadFunc pFunc,void *pPara)

{
  iterator __position;
  int iVar1;
  unsigned_long in_RAX;
  pthread_t pt;
  unsigned_long local_18;
  
  local_18 = in_RAX;
  iVar1 = pthread_create(&local_18,(pthread_attr_t *)0x0,(__start_routine *)pFunc,pPara);
  if (iVar1 == 0) {
    __position._M_current =
         (this->m_vecHandle).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_vecHandle).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      (this->m_vecHandle).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return iVar1;
}

Assistant:

HANDLE CreateThread( PThreadFunc pFunc,void *pPara)
            {	
                pthread_t pt;
                int nErrorCode=pthread_create(&pt,NULL,pFunc,pPara);
                if(nErrorCode!=0)
                  return nErrorCode;
                m_vecHandle.push_back(pt);	//加入线程列表 为WaitForMultipleObjects准备	
                return nErrorCode;

            }